

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

uint64_t __thiscall
Imf_3_4::IDManifest::ChannelGroupManifest::insert(ChannelGroupManifest *this,string *text)

{
  __type _Var1;
  uint uVar2;
  uint64_t idValue;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  _Var1 = std::operator==(&this->_hashScheme,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          MURMURHASH3_32_abi_cxx11_);
  if (_Var1) {
    uVar2 = MurmurHash32(text);
    idValue = (uint64_t)uVar2;
  }
  else {
    _Var1 = std::operator==(&this->_hashScheme,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            MURMURHASH3_64_abi_cxx11_);
    if (!_Var1) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
      std::operator<<(local_190,"Cannot compute hash: unknown hashing scheme");
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&_iex_throw_s);
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    idValue = MurmurHash64(text);
  }
  insert(this,idValue,text);
  return idValue;
}

Assistant:

uint64_t
IDManifest::ChannelGroupManifest::insert (const std::string& text)
{
    uint64_t hash;
    if (_hashScheme == MURMURHASH3_32) { hash = MurmurHash32 (text); }
    else if (_hashScheme == MURMURHASH3_64) { hash = MurmurHash64 (text); }
    else
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot compute hash: unknown hashing scheme");
    }
    insert (hash, text);
    return hash;
}